

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O1

double ON_SubDSectorType::CopyEdgeSectorCoefficient
                 (ON_SubDEdge *edge,ON_SubDVertex *vertex,double error_return_value)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  
  if (vertex == (ON_SubDVertex *)0x0 || edge == (ON_SubDEdge *)0x0) {
    return error_return_value;
  }
  if (edge->m_vertex[0] == vertex) {
    uVar3 = 0;
  }
  else {
    uVar3 = (edge->m_vertex[1] != vertex) + 1;
  }
  bVar1 = true;
  dVar4 = error_return_value;
  if (1 < uVar3) goto LAB_006388e7;
  bVar2 = ON_SubDEdge::IsSmooth(edge);
  if (bVar2) {
    bVar2 = ON_SubDVertex::IsDartOrCreaseOrCorner(vertex);
    if (bVar2) {
      bVar1 = false;
      dVar4 = edge->m_sector_coefficient[uVar3];
      goto LAB_006388e7;
    }
    bVar2 = ON_SubDVertex::IsSmooth(vertex);
    dVar4 = extraout_XMM0_Qa_00;
    if (!bVar2) goto LAB_006388e7;
    dVar4 = edge->m_sector_coefficient[uVar3];
  }
  else {
    bVar2 = ON_SubDEdge::IsCrease(edge);
    dVar4 = extraout_XMM0_Qa;
    if (!bVar2) goto LAB_006388e7;
    dVar4 = 0.0;
  }
  bVar1 = false;
LAB_006388e7:
  if (bVar1) {
    return error_return_value;
  }
  return dVar4;
}

Assistant:

double ON_SubDSectorType::CopyEdgeSectorCoefficient(
  const class ON_SubDEdge* edge,
  const class ON_SubDVertex* vertex,
  double error_return_value
)
{
  if ( nullptr != edge  && nullptr != vertex )
  {
    const int evi = (vertex == edge->m_vertex[0]) ? 0 : (vertex == edge->m_vertex[1] ? 1 : 2);
    if (evi < 2)
    {
      if (edge->IsSmooth())
      {
        if ( vertex->IsDartOrCreaseOrCorner() )
          return edge->m_sector_coefficient[evi];
        if ( vertex->IsSmooth() )
          return edge->m_sector_coefficient[evi];
      }
      else if ( edge->IsCrease() )
      {
        return ON_SubDSectorType::IgnoredSectorCoefficient;
      }
    }
  }

  // null pointers, unset tags, vertex and edge are not attached, 
  // or other conditions where returning a m_sector_coefficient[] 
  // is impossible or makes no sense.
  return error_return_value;
}